

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  value *pvVar2;
  ostream *poVar3;
  undefined8 uVar4;
  bool *pbVar5;
  char *pcVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  service srv;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  undefined1 local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  undefined1 local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  cppcms::service::service(&srv,argc,argv);
  pvVar2 = (value *)cppcms::service::settings();
  cppcms::json::value::get_abi_cxx11_((string *)&local_58,pvVar2,"test.async","sync");
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_58,"sync");
  std::__cxx11::string::~string((string *)local_58._M_pod_data);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Synchronous testing");
    std::endl<char,std::char_traits<char>>(poVar3);
    uVar4 = cppcms::service::applications_pool();
    cppcms::create_pool<unit_test>();
    cppcms::applications_pool::mount(uVar4,local_28,0);
    this = &local_20;
  }
  else {
    pvVar2 = (value *)cppcms::service::settings();
    cppcms::json::value::get<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,pvVar2
               ,"test.async");
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_58,"async");
    std::__cxx11::string::~string((string *)local_58._M_pod_data);
    if (bVar1) {
      pcVar6 = "Asynchronous testing";
      pbVar5 = &is_async;
    }
    else {
      pvVar2 = (value *)cppcms::service::settings();
      cppcms::json::value::get<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,
                 pvVar2,"test.async");
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_58,"nonblocking");
      std::__cxx11::string::~string((string *)local_58._M_pod_data);
      if (!bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Invalid configuration value of test.async");
        std::endl<char,std::char_traits<char>>(poVar3);
        cppcms::service::~service(&srv);
        return 1;
      }
      is_async = true;
      pcVar6 = "Non blocking testing";
      pbVar5 = &is_nonblocking;
    }
    *pbVar5 = true;
    poVar3 = std::operator<<((ostream *)&std::cout,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar3);
    uVar4 = cppcms::service::applications_pool();
    cppcms::create_pool<unit_test>();
    cppcms::applications_pool::mount(uVar4,local_38,1);
    this = &local_30;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this);
  local_58._8_8_ = 0;
  local_40 = std::_Function_handler<void_(),_submitter>::_M_invoke;
  local_48 = std::_Function_handler<void_(),_submitter>::_M_manager;
  local_58._M_unused._0_8_ = (undefined8)(function *)&srv;
  cppcms::service::after_fork((function *)&srv);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  cppcms::service::run();
  cppcms::service::~service(&srv);
  return run_ok ^ 1;
}

Assistant:

int main(int argc,char **argv)
{
	try {
		cppcms::service srv(argc,argv);
		if(srv.settings().get("test.async","sync")=="sync") {
			std::cout << "Synchronous testing" << std::endl;
			srv.applications_pool().mount( cppcms::create_pool<unit_test>());
		}
		else {
			if(srv.settings().get<std::string>("test.async")=="async") {
				is_async = true;
				std::cout << "Asynchronous testing" << std::endl;
			}
			else if(srv.settings().get<std::string>("test.async")=="nonblocking") {
				is_async = true;
				is_nonblocking = true;
				std::cout << "Non blocking testing" << std::endl;
			}
			else {
				std::cerr << "Invalid configuration value of test.async" << std::endl;
				return 1;
			}
			srv.applications_pool().mount( cppcms::create_pool<unit_test>(),cppcms::app::asynchronous);
		}
		srv.after_fork(submitter(srv));
		srv.run();
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return EXIT_FAILURE;
	}
	return run_ok ? EXIT_SUCCESS : EXIT_FAILURE;
}